

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

void __thiscall cppcms::encoding::impl::validators_set::validators_set(validators_set *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pp_Var2;
  key_type kStack_78;
  key_type local_58;
  allocator local_32;
  allocator local_31;
  
  p_Var1 = &(this->predefined_)._M_t._M_impl.super__Rb_tree_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&kStack_78,"latin1",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88591",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88592",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88594",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88595",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88599",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885910",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885913",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885914",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885915",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885916",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88593",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_3_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88596",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_6_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88597",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_7_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso88598",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_8_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"iso885911",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = iso_8859_11_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1250",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1250_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1251",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1251_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1252",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1252_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1253",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1253_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1255",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1255_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1256",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1256_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1257",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1257_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"windows1258",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1258_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1250",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1250_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1251",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1251_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1252",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1252_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1253",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1253_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1255",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1255_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1256",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1256_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1257",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1257_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"cp1258",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = windows_1258_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"koi8r",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = koi8_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"koi8u",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = koi8_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"utf8",(allocator *)&local_58);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = utf8_valid<char_const*>;
  std::__cxx11::string::~string((string *)&kStack_78);
  std::__cxx11::string::string((string *)&kStack_78,"ascii",&local_31);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&kStack_78);
  *pp_Var2 = ascii_valid<char_const*>;
  std::__cxx11::string::string((string *)&local_58,"usascii",&local_32);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_58);
  *pp_Var2 = ascii_valid<char_const*>;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&kStack_78);
  return;
}

Assistant:

validators_set() 
		{

			encoding_tester_type iso_tester=&iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char const *>;

			
			predefined_["latin1"]=iso_tester;
			
			predefined_["iso88591"]=iso_tester;
			predefined_["iso88592"]=iso_tester;
			predefined_["iso88594"]=iso_tester;
			predefined_["iso88595"]=iso_tester;
			predefined_["iso88599"]=iso_tester;
			predefined_["iso885910"]=iso_tester;
			predefined_["iso885913"]=iso_tester;
			predefined_["iso885914"]=iso_tester;
			predefined_["iso885915"]=iso_tester;
			predefined_["iso885916"]=iso_tester;

			predefined_["iso88593"]=&iso_8859_3_valid<char const *>;
			predefined_["iso88596"]=&iso_8859_6_valid<char const *>;
			predefined_["iso88597"]=&iso_8859_7_valid<char const *>;
			predefined_["iso88598"]=&iso_8859_8_valid<char const *>;
			predefined_["iso885911"]=&iso_8859_11_valid<char const *>;

			predefined_["windows1250"]=&windows_1250_valid<char const *>;
			predefined_["windows1251"]=&windows_1251_valid<char const *>;
			predefined_["windows1252"]=&windows_1252_valid<char const *>;
			predefined_["windows1253"]=&windows_1253_valid<char const *>;
			predefined_["windows1255"]=&windows_1255_valid<char const *>;
			predefined_["windows1256"]=&windows_1256_valid<char const *>;
			predefined_["windows1257"]=&windows_1257_valid<char const *>;
			predefined_["windows1258"]=&windows_1258_valid<char const *>;

			predefined_["cp1250"]=&windows_1250_valid<char const *>;
			predefined_["cp1251"]=&windows_1251_valid<char const *>;
			predefined_["cp1252"]=&windows_1252_valid<char const *>;
			predefined_["cp1253"]=&windows_1253_valid<char const *>;
			predefined_["cp1255"]=&windows_1255_valid<char const *>;
			predefined_["cp1256"]=&windows_1256_valid<char const *>;
			predefined_["cp1257"]=&windows_1257_valid<char const *>;
			predefined_["cp1258"]=&windows_1258_valid<char const *>;

			predefined_["koi8r"]=&koi8_valid<char const *>;
			predefined_["koi8u"]=&koi8_valid<char const *>;
			
			predefined_["utf8"]=&utf8_valid<char const *>;
			predefined_["usascii"]=predefined_["ascii"]=&ascii_valid<char const *>;
		}